

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O0

void __thiscall cmGeneratorTarget::ComputeTargetManifest(cmGeneratorTarget *this,string *config)

{
  bool bVar1;
  TargetType TVar2;
  ulong uVar3;
  cmAlphaNum local_558;
  string local_528;
  cmAlphaNum local_508;
  string local_4d8;
  cmAlphaNum local_4b8;
  cmAlphaNum local_488;
  string local_458;
  cmAlphaNum local_438;
  cmAlphaNum local_408;
  string local_3d8;
  cmAlphaNum local_3b8;
  cmAlphaNum local_388;
  string local_358;
  cmAlphaNum local_338;
  cmAlphaNum local_308;
  string local_2d8;
  undefined1 local_2b8 [8];
  string f;
  string dir;
  Names local_270;
  Names local_1b0;
  undefined1 local_e0 [8];
  Names targetNames;
  cmGlobalGenerator *gg;
  string *config_local;
  cmGeneratorTarget *this_local;
  
  bVar1 = IsImported(this);
  if (bVar1) {
    return;
  }
  targetNames.SharedObject.field_2._8_8_ =
       cmLocalGenerator::GetGlobalGenerator(this->LocalGenerator);
  Names::Names((Names *)local_e0);
  TVar2 = GetType(this);
  if (TVar2 == EXECUTABLE) {
    GetExecutableNames(&local_1b0,this,config);
    Names::operator=((Names *)local_e0,&local_1b0);
    Names::~Names(&local_1b0);
  }
  else {
    TVar2 = GetType(this);
    if (((TVar2 != STATIC_LIBRARY) && (TVar2 = GetType(this), TVar2 != SHARED_LIBRARY)) &&
       (TVar2 = GetType(this), TVar2 != MODULE_LIBRARY)) goto LAB_005a03f4;
    GetLibraryNames(&local_270,this,config);
    Names::operator=((Names *)local_e0,&local_270);
    Names::~Names(&local_270);
  }
  GetDirectory((string *)((long)&f.field_2 + 8),this,config,RuntimeBinaryArtifact);
  std::__cxx11::string::string((string *)local_2b8);
  uVar3 = std::__cxx11::string::empty();
  if ((uVar3 & 1) == 0) {
    cmAlphaNum::cmAlphaNum(&local_308,(string *)((long)&f.field_2 + 8));
    cmAlphaNum::cmAlphaNum(&local_338,'/');
    cmStrCat<std::__cxx11::string>
              (&local_2d8,&local_308,&local_338,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               ((long)&targetNames.Base.field_2 + 8));
    std::__cxx11::string::operator=((string *)local_2b8,(string *)&local_2d8);
    std::__cxx11::string::~string((string *)&local_2d8);
    cmGlobalGenerator::AddToManifest
              ((cmGlobalGenerator *)targetNames.SharedObject.field_2._8_8_,(string *)local_2b8);
  }
  uVar3 = std::__cxx11::string::empty();
  if ((uVar3 & 1) == 0) {
    cmAlphaNum::cmAlphaNum(&local_388,(string *)((long)&f.field_2 + 8));
    cmAlphaNum::cmAlphaNum(&local_3b8,'/');
    cmStrCat<std::__cxx11::string>
              (&local_358,&local_388,&local_3b8,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               ((long)&targetNames.PDB.field_2 + 8));
    std::__cxx11::string::operator=((string *)local_2b8,(string *)&local_358);
    std::__cxx11::string::~string((string *)&local_358);
    cmGlobalGenerator::AddToManifest
              ((cmGlobalGenerator *)targetNames.SharedObject.field_2._8_8_,(string *)local_2b8);
  }
  uVar3 = std::__cxx11::string::empty();
  if ((uVar3 & 1) == 0) {
    cmAlphaNum::cmAlphaNum(&local_408,(string *)((long)&f.field_2 + 8));
    cmAlphaNum::cmAlphaNum(&local_438,'/');
    cmStrCat<std::__cxx11::string>
              (&local_3d8,&local_408,&local_438,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               ((long)&targetNames.Output.field_2 + 8));
    std::__cxx11::string::operator=((string *)local_2b8,(string *)&local_3d8);
    std::__cxx11::string::~string((string *)&local_3d8);
    cmGlobalGenerator::AddToManifest
              ((cmGlobalGenerator *)targetNames.SharedObject.field_2._8_8_,(string *)local_2b8);
  }
  uVar3 = std::__cxx11::string::empty();
  if ((uVar3 & 1) == 0) {
    cmAlphaNum::cmAlphaNum(&local_488,(string *)((long)&f.field_2 + 8));
    cmAlphaNum::cmAlphaNum(&local_4b8,'/');
    cmStrCat<std::__cxx11::string>
              (&local_458,&local_488,&local_4b8,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               ((long)&targetNames.ImportLibrary.field_2 + 8));
    std::__cxx11::string::operator=((string *)local_2b8,(string *)&local_458);
    std::__cxx11::string::~string((string *)&local_458);
    cmGlobalGenerator::AddToManifest
              ((cmGlobalGenerator *)targetNames.SharedObject.field_2._8_8_,(string *)local_2b8);
  }
  uVar3 = std::__cxx11::string::empty();
  if ((uVar3 & 1) == 0) {
    GetDirectory(&local_528,this,config,ImportLibraryArtifact);
    cmAlphaNum::cmAlphaNum(&local_508,&local_528);
    cmAlphaNum::cmAlphaNum(&local_558,'/');
    cmStrCat<std::__cxx11::string>
              (&local_4d8,&local_508,&local_558,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               ((long)&targetNames.Real.field_2 + 8));
    std::__cxx11::string::operator=((string *)local_2b8,(string *)&local_4d8);
    std::__cxx11::string::~string((string *)&local_4d8);
    std::__cxx11::string::~string((string *)&local_528);
    cmGlobalGenerator::AddToManifest
              ((cmGlobalGenerator *)targetNames.SharedObject.field_2._8_8_,(string *)local_2b8);
  }
  std::__cxx11::string::~string((string *)local_2b8);
  std::__cxx11::string::~string((string *)(f.field_2._M_local_buf + 8));
LAB_005a03f4:
  Names::~Names((Names *)local_e0);
  return;
}

Assistant:

void cmGeneratorTarget::ComputeTargetManifest(const std::string& config) const
{
  if (this->IsImported()) {
    return;
  }
  cmGlobalGenerator* gg = this->LocalGenerator->GetGlobalGenerator();

  // Get the names.
  cmGeneratorTarget::Names targetNames;
  if (this->GetType() == cmStateEnums::EXECUTABLE) {
    targetNames = this->GetExecutableNames(config);
  } else if (this->GetType() == cmStateEnums::STATIC_LIBRARY ||
             this->GetType() == cmStateEnums::SHARED_LIBRARY ||
             this->GetType() == cmStateEnums::MODULE_LIBRARY) {
    targetNames = this->GetLibraryNames(config);
  } else {
    return;
  }

  // Get the directory.
  std::string dir =
    this->GetDirectory(config, cmStateEnums::RuntimeBinaryArtifact);

  // Add each name.
  std::string f;
  if (!targetNames.Output.empty()) {
    f = cmStrCat(dir, '/', targetNames.Output);
    gg->AddToManifest(f);
  }
  if (!targetNames.SharedObject.empty()) {
    f = cmStrCat(dir, '/', targetNames.SharedObject);
    gg->AddToManifest(f);
  }
  if (!targetNames.Real.empty()) {
    f = cmStrCat(dir, '/', targetNames.Real);
    gg->AddToManifest(f);
  }
  if (!targetNames.PDB.empty()) {
    f = cmStrCat(dir, '/', targetNames.PDB);
    gg->AddToManifest(f);
  }
  if (!targetNames.ImportLibrary.empty()) {
    f =
      cmStrCat(this->GetDirectory(config, cmStateEnums::ImportLibraryArtifact),
               '/', targetNames.ImportLibrary);
    gg->AddToManifest(f);
  }
}